

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

text * __thiscall lest::env::context_abi_cxx11_(text *__return_storage_ptr__,env *this)

{
  text local_38;
  env *local_18;
  env *this_local;
  
  local_18 = this;
  this_local = (env *)__return_storage_ptr__;
  sections_abi_cxx11_(&local_38,this);
  std::operator+(__return_storage_ptr__,&this->testing,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

text context() { return testing + sections(); }